

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cecSatG.c
# Opt level: O0

int Cec3_ManSolveTwo(Cec3_Man_t *p,int iObj0,int iObj1,int fPhase)

{
  Gia_Man_t *pGVar1;
  bmcg_sat_solver *pbVar2;
  int iVar3;
  Gia_Obj_t *pGVar4;
  int *piVar5;
  bool bVar6;
  int local_48;
  int local_44;
  int Lits [2];
  int iVar1;
  int iVar0;
  int i;
  int status;
  Gia_Obj_t *pObj;
  int local_20;
  int fPhase_local;
  int iObj1_local;
  int iObj0_local;
  Cec3_Man_t *p_local;
  
  local_20 = iObj1;
  fPhase_local = iObj0;
  if (iObj1 < iObj0) {
    local_20 = iObj0;
    fPhase_local = iObj1;
  }
  if (local_20 <= fPhase_local) {
    __assert_fail("iObj0 < iObj1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/cec/cecSatG.c"
                  ,0x32d,"int Cec3_ManSolveTwo(Cec3_Man_t *, int, int, int)");
  }
  if ((p->pPars->fUseCones == 0) && (iVar3 = bmcg_sat_solver_varnum(p->pSat), iVar3 != 0)) {
    __assert_fail("p->pPars->fUseCones || bmcg_sat_solver_varnum(p->pSat) == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/cec/cecSatG.c"
                  ,0x32e,"int Cec3_ManSolveTwo(Cec3_Man_t *, int, int, int)");
  }
  if (fPhase_local == 0) {
    pGVar1 = p->pNew;
    pGVar4 = Gia_ManConst0(p->pNew);
    iVar3 = Cec3_ObjSatId(pGVar1,pGVar4);
    if (iVar3 == -1) {
      pGVar1 = p->pNew;
      pGVar4 = Gia_ManConst0(p->pNew);
      iVar3 = bmcg_sat_solver_addvar(p->pSat);
      Cec3_ObjSetSatId(pGVar1,pGVar4,iVar3);
    }
  }
  Lits[1] = Cec3_ObjGetCnfVar(p,fPhase_local);
  Lits[0] = Cec3_ObjGetCnfVar(p,local_20);
  Vec_IntClear(p->vNodesNew);
  Vec_IntClear(p->vSatVars);
  Vec_IntClear(p->vObjSatPairs);
  Gia_ManIncrementTravId(p->pNew);
  Cec3_ManCollect_rec(p,fPhase_local);
  Cec3_ManCollect_rec(p,local_20);
  if (p->pPars->fUseCones != 0) {
    pbVar2 = p->pSat;
    piVar5 = Vec_IntArray(p->vSatVars);
    iVar3 = Vec_IntSize(p->vSatVars);
    satoko_mark_cone(pbVar2,piVar5,iVar3);
  }
  local_48 = Abc_Var2Lit(Lits[1],1);
  local_44 = Abc_Var2Lit(Lits[0],fPhase);
  bmcg_sat_solver_set_conflict_budget(p->pSat,p->pPars->nConfLimit);
  iVar0 = bmcg_sat_solver_solve(p->pSat,&local_48,2);
  if ((iVar0 == -1) && (0 < fPhase_local)) {
    local_48 = Abc_Var2Lit(Lits[1],0);
    local_44 = Abc_Var2Lit(Lits[0],(uint)((fPhase != 0 ^ 0xffU) & 1));
    bmcg_sat_solver_set_conflict_budget(p->pSat,p->pPars->nConfLimit);
    iVar0 = bmcg_sat_solver_solve(p->pSat,&local_48,2);
  }
  if (p->pPars->fUseCones != 0) {
    pbVar2 = p->pSat;
    piVar5 = Vec_IntArray(p->vSatVars);
    iVar3 = Vec_IntSize(p->vSatVars);
    satoko_unmark_cone(pbVar2,piVar5,iVar3);
  }
  if (p->pPars->fUseCones == 0) {
    iVar1 = 0;
    while( true ) {
      iVar3 = Vec_IntSize(p->vNodesNew);
      bVar6 = false;
      if (iVar1 < iVar3) {
        pGVar1 = p->pNew;
        iVar3 = Vec_IntEntry(p->vNodesNew,iVar1);
        _i = Gia_ManObj(pGVar1,iVar3);
        bVar6 = _i != (Gia_Obj_t *)0x0;
      }
      if (!bVar6) break;
      Cec3_ObjCleanSatId(p->pNew,_i);
      iVar1 = iVar1 + 1;
    }
  }
  return iVar0;
}

Assistant:

int Cec3_ManSolveTwo( Cec3_Man_t * p, int iObj0, int iObj1, int fPhase )
{
    Gia_Obj_t * pObj;
    int status, i, iVar0, iVar1, Lits[2];
    if (iObj1 < iObj0) 
        iObj1 ^= iObj0, iObj0 ^= iObj1, iObj1 ^= iObj0;
    assert( iObj0 < iObj1 );
    assert( p->pPars->fUseCones || bmcg_sat_solver_varnum(p->pSat) == 0 );
    if ( !iObj0 && Cec3_ObjSatId(p->pNew, Gia_ManConst0(p->pNew)) == -1 )
        Cec3_ObjSetSatId( p->pNew, Gia_ManConst0(p->pNew), bmcg_sat_solver_addvar(p->pSat) );
    iVar0 = Cec3_ObjGetCnfVar( p, iObj0 );
    iVar1 = Cec3_ObjGetCnfVar( p, iObj1 );
    // collect inputs and internal nodes
    Vec_IntClear( p->vNodesNew );
    Vec_IntClear( p->vSatVars );
    Vec_IntClear( p->vObjSatPairs );
    Gia_ManIncrementTravId( p->pNew );
    Cec3_ManCollect_rec( p, iObj0 );
    Cec3_ManCollect_rec( p, iObj1 );
//printf( "%d ", Vec_IntSize(p->vNodesNew) );
    // solve direct
    if ( p->pPars->fUseCones )  satoko_mark_cone( p->pSat, Vec_IntArray(p->vSatVars), Vec_IntSize(p->vSatVars) );
//    satoko_assump_push( p->pSat, Abc_Var2Lit(iVar0, 1) );
//    satoko_assump_push( p->pSat, Abc_Var2Lit(iVar1, fPhase) );
//    status = satoko_solve( p->pSat );
//    satoko_assump_pop( p->pSat );
//    satoko_assump_pop( p->pSat );
    Lits[0] = Abc_Var2Lit(iVar0, 1);
    Lits[1] = Abc_Var2Lit(iVar1, fPhase);
    bmcg_sat_solver_set_conflict_budget( p->pSat, p->pPars->nConfLimit );
    status = bmcg_sat_solver_solve( p->pSat, Lits, 2 );
    if ( status == GLUCOSE_UNSAT && iObj0 > 0 )
    {
        // solve reverse
//        satoko_assump_push( p->pSat, Abc_Var2Lit(iVar0, 0) );
//        satoko_assump_push( p->pSat, Abc_Var2Lit(iVar1, !fPhase) );
//        status = satoko_solve( p->pSat );
//        satoko_assump_pop( p->pSat );
//        satoko_assump_pop( p->pSat );
        Lits[0] = Abc_Var2Lit(iVar0, 0);
        Lits[1] = Abc_Var2Lit(iVar1, !fPhase);
        bmcg_sat_solver_set_conflict_budget( p->pSat, p->pPars->nConfLimit );
        status = bmcg_sat_solver_solve( p->pSat, Lits, 2 );
    }
    if ( p->pPars->fUseCones )  satoko_unmark_cone( p->pSat, Vec_IntArray(p->vSatVars), Vec_IntSize(p->vSatVars) );
    //if ( status == SATOKO_SAT )
    //    Cec3_ManVerify( p->pNew, iObj0, iObj1, fPhase, p->pSat );
    if ( p->pPars->fUseCones )
        return status;
    Gia_ManForEachObjVec( p->vNodesNew, p->pNew, pObj, i )
        Cec3_ObjCleanSatId( p->pNew, pObj );
    return status;
}